

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::on_storage_moved
          (torrent *this,status_t status,string *path,storage_error *error)

{
  storage_error *args_1;
  bool bVar1;
  file_index_t file;
  alert_manager *paVar2;
  bool local_99;
  string local_88;
  undefined1 local_68 [22];
  bitfield_flag local_52;
  undefined1 local_51;
  undefined1 local_50 [35];
  bitfield_flag local_2d;
  undefined1 local_2c;
  uchar local_2b;
  bitfield_flag local_2a;
  bool local_29;
  storage_error *psStack_28;
  bool has_error_status;
  storage_error *error_local;
  string *path_local;
  torrent *this_local;
  status_t status_local;
  
  *(uint *)&this->field_0x600 = *(uint *)&this->field_0x600 & 0xffffffdf;
  local_2c = 1;
  local_2b = status.m_val;
  psStack_28 = error;
  error_local = (storage_error *)path;
  path_local = (string *)this;
  this_local._7_1_ = status.m_val;
  local_2a = (bitfield_flag)
             libtorrent::flags::operator&
                       ((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>)
                        status.m_val,
                        (bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>)0x1
                       );
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_2a);
  local_99 = true;
  if (!bVar1) {
    local_50[0x22] = this_local._7_1_;
    local_50[0x21] = 4;
    local_2d = (bitfield_flag)
               libtorrent::flags::operator&
                         ((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>)
                          this_local._7_1_,
                          (bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>)
                          0x4);
    local_99 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_2d);
  }
  local_29 = local_99;
  if (local_99 == false) {
    paVar2 = alerts(this);
    bVar1 = alert_manager::should_post<libtorrent::storage_moved_alert>(paVar2);
    if (bVar1) {
      paVar2 = alerts(this);
      get_handle((torrent *)local_50);
      alert_manager::
      emplace_alert<libtorrent::storage_moved_alert,libtorrent::torrent_handle,std::__cxx11::string_const&,std::__cxx11::string&>
                (paVar2,(torrent_handle *)local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)error_local,
                 &this->m_save_path);
      torrent_handle::~torrent_handle((torrent_handle *)local_50);
    }
    ::std::__cxx11::string::operator=((string *)&this->m_save_path,(string *)error_local);
    local_51 = 0x20;
    set_need_save_resume(this,(resume_data_flags_t)0x20);
    local_68[0x15] = this_local._7_1_;
    local_68[0x14] = 2;
    local_52 = (bitfield_flag)
               libtorrent::flags::operator&
                         ((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>)
                          this_local._7_1_,
                          (bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>)
                          0x2);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_52);
    if (bVar1) {
      force_recheck(this);
    }
  }
  else {
    paVar2 = alerts(this);
    bVar1 = alert_manager::should_post<libtorrent::storage_moved_failed_alert>(paVar2);
    if (bVar1) {
      paVar2 = alerts(this);
      get_handle((torrent *)local_68);
      args_1 = psStack_28;
      file = storage_error::file(psStack_28);
      resolve_filename_abi_cxx11_(&local_88,this,file);
      alert_manager::
      emplace_alert<libtorrent::storage_moved_failed_alert,libtorrent::torrent_handle,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&>
                (paVar2,(torrent_handle *)local_68,&args_1->ec,&local_88,&psStack_28->operation);
      ::std::__cxx11::string::~string((string *)&local_88);
      torrent_handle::~torrent_handle((torrent_handle *)local_68);
    }
  }
  return;
}

Assistant:

void torrent::on_storage_moved(status_t const status, std::string const& path
		, storage_error const& error) try
	{
		TORRENT_ASSERT(is_single_thread());

		m_moving_storage = false;
		bool const has_error_status
			= (status & disk_status::fatal_disk_error)
			|| (status & disk_status::file_exist);

		if (!has_error_status)
		{
			if (alerts().should_post<storage_moved_alert>())
				alerts().emplace_alert<storage_moved_alert>(get_handle(), path, m_save_path);
			m_save_path = path;
			set_need_save_resume(torrent_handle::if_config_changed);
			if (status & disk_status::need_full_check)
				force_recheck();
		}
		else
		{
			if (alerts().should_post<storage_moved_failed_alert>())
				alerts().emplace_alert<storage_moved_failed_alert>(get_handle(), error.ec
					, resolve_filename(error.file()), error.operation);
		}
	}
	catch (...) { handle_exception(); }